

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_utils.h
# Opt level: O0

void __thiscall auto_array<short>::push_silence(auto_array<short> *this,size_t length)

{
  short *in_RSI;
  long *in_RDI;
  size_t unaff_retaddr;
  
  if ((ulong)in_RDI[1] < (ulong)(in_RDI[2] + (long)in_RSI)) {
    reserve((auto_array<short> *)length,unaff_retaddr);
  }
  if (*in_RDI != 0) {
    PodZero<short>(in_RSI,(size_t)in_RDI);
  }
  in_RDI[2] = (long)in_RSI + in_RDI[2];
  return;
}

Assistant:

void push_silence(size_t length)
  {
    if (length_ + length > capacity_) {
      reserve(length + length_);
    }
    if (data_) {
      PodZero(data_ + length_, length);
    }
    length_ += length;
  }